

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

void prf_state_copy(prf_state_t *copy,prf_state_t *original)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  matrix4x4_f32_t *m;
  int i;
  int cnt;
  int in_stack_ffffffffffffffdc;
  void *in_stack_ffffffffffffffe0;
  int iVar4;
  int iVar5;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  *(undefined2 *)((long)in_RDI + 0x74) = *(undefined2 *)((long)in_RSI + 0x74);
  *(undefined4 *)(in_RDI + 0xe) = *(undefined4 *)(in_RSI + 0xe);
  in_RDI[2] = in_RSI[2];
  in_RDI[3] = in_RSI[3];
  in_RDI[4] = in_RSI[4];
  in_RDI[5] = in_RSI[5];
  *(undefined4 *)(in_RDI + 0xb) = *(undefined4 *)(in_RSI + 0xb);
  iVar1 = prf_array_count((void *)0x1065e8);
  pvVar3 = prf_array_set_count(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  in_RDI[6] = pvVar3;
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    pvVar3 = prf_array_append_ptr(in_RSI,(void *)CONCAT44(iVar1,iVar4));
    in_RDI[6] = pvVar3;
  }
  iVar1 = prf_array_count((void *)0x106661);
  pvVar3 = prf_array_set_count(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  in_RDI[7] = pvVar3;
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    pvVar3 = prf_array_append_ptr(in_RSI,(void *)CONCAT44(iVar1,iVar4));
    in_RDI[7] = pvVar3;
  }
  iVar1 = prf_array_count((void *)0x1066da);
  pvVar3 = prf_array_set_count(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  in_RDI[8] = pvVar3;
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    pvVar3 = prf_array_append_ptr(in_RSI,(void *)CONCAT44(iVar1,iVar4));
    in_RDI[8] = pvVar3;
  }
  iVar1 = prf_array_count((void *)0x106753);
  iVar4 = 0;
  do {
    if ((int)(uint)*(ushort *)((long)in_RSI + 0x7e) < iVar4) {
      if (*(int *)(in_RDI + 0xb) == 0) {
        memcpy((void *)in_RDI[10],(void *)in_RSI[10],0x40);
      }
      *(undefined2 *)((long)in_RDI + 0x76) = *(undefined2 *)((long)in_RSI + 0x76);
      *(undefined2 *)(in_RDI + 0xf) = *(undefined2 *)(in_RSI + 0xf);
      *(undefined2 *)((long)in_RDI + 0x7c) = *(undefined2 *)((long)in_RSI + 0x7c);
      *(undefined2 *)((long)in_RDI + 0x7a) = *(undefined2 *)((long)in_RSI + 0x7a);
      *(undefined2 *)((long)in_RDI + 0x7e) = *(undefined2 *)((long)in_RSI + 0x7e);
      *(undefined2 *)(in_RDI + 0x10) = *(undefined2 *)(in_RSI + 0x10);
      return;
    }
    iVar5 = iVar4;
    iVar2 = prf_array_count((void *)0x10678a);
    if (iVar2 <= iVar4) {
      pvVar3 = malloc(0x40);
      if (pvVar3 == (void *)0x0) {
        prf_error(9,"memory allocation failure (malloc returned NULL)");
        return;
      }
      pvVar3 = prf_array_append_ptr(in_RSI,(void *)CONCAT44(iVar1,iVar5));
      in_RDI[9] = pvVar3;
    }
    memcpy(*(void **)(in_RDI[9] + (long)iVar5 * 8),*(void **)(in_RSI[9] + (long)iVar5 * 8),0x40);
    iVar4 = iVar5 + 1;
  } while( true );
}

Assistant:

void
prf_state_copy(
    prf_state_t * copy,
    prf_state_t * original )
{
    int cnt, i;
    assert( copy != NULL && original != NULL );
    copy->model = original->model;
    copy->node = original->node;
    copy->object_transparency = original->object_transparency;
    copy->object_flags = original->object_flags;
    copy->header = original->header;
    copy->vertex_palette = original->vertex_palette;
    copy->color_palette = original->color_palette;
    copy->material_palette = original->material_palette;
    copy->inv_dirty = original->inv_dirty;

    cnt = prf_array_count( original->materials );
    copy->materials = (prf_node_t **)prf_array_set_count( copy->materials, 0 );
    for ( i = 0; i < cnt; i++ ) {
      copy->materials = (prf_node_t **)
	prf_array_append_ptr( copy->materials, original->materials[i] );
    }

    cnt = prf_array_count( original->textures );
    copy->textures = (prf_node_t **)prf_array_set_count( copy->textures, 0 );
    for ( i = 0; i < cnt; i++ ) {
      copy->textures = (prf_node_t **)
	prf_array_append_ptr( copy->textures, original->textures[i] );
    }

    cnt = prf_array_count( original->instances );
    copy->instances = (prf_node_t **)prf_array_set_count( copy->instances, 0 );
    for ( i = 0; i < cnt; i++ ) {
      copy->instances = (prf_node_t **)
	prf_array_append_ptr( copy->instances, original->instances[i] );
    }
    


    cnt = prf_array_count( original->matrix );
    
    for ( i = 0; i <= original->state_push_level; i++ ) {
        if ( i >= prf_array_count( copy->matrix ) ) {
            matrix4x4_f32_t * m;
            m = (matrix4x4_f32_t *)malloc( sizeof( matrix4x4_f32_t ) );
            if ( m == NULL ) {
                prf_error( 9,
                    "memory allocation failure (malloc returned NULL)" );
                return;
            }
            copy->matrix = 
	      (matrix4x4_f32_t **)prf_array_append_ptr( copy->matrix, m );
        }
        memcpy( copy->matrix[i], original->matrix[i],
            sizeof( matrix4x4_f32_t ) );
    }

    if ( copy->inv_dirty == FALSE )
        memcpy( copy->inv_matrix, original->inv_matrix,
            sizeof( matrix4x4_f32_t ) );

    copy->push_level = original->push_level;
    copy->subface_level = original->subface_level;
    copy->extension_level = original->extension_level;
    copy->attribute_level = original->attribute_level;

    copy->state_push_level = original->state_push_level;
    copy->physical_level = original->physical_level;

}